

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_code.hpp
# Opt level: O0

bool __thiscall
system_error2::_generic_code_domain::_do_equivalent
          (_generic_code_domain *this,status_code<void> *code1,status_code<void> *code2)

{
  value_type vVar1;
  bool bVar2;
  status_code_domain *psVar3;
  value_type *pvVar4;
  generic_code *c2;
  generic_code *c1;
  status_code<void> *code2_local;
  status_code<void> *code1_local;
  _generic_code_domain *this_local;
  
  psVar3 = status_code<void>::domain(code1);
  bVar2 = status_code_domain::operator==(psVar3,&this->super_status_code_domain);
  if (!bVar2) {
    __assert_fail("code1.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/generic_code.hpp"
                  ,0x153,
                  "virtual bool system_error2::_generic_code_domain::_do_equivalent(const status_code<void> &, const status_code<void> &) const"
                 );
  }
  psVar3 = status_code<void>::domain(code2);
  bVar2 = status_code_domain::operator==(psVar3,&this->super_status_code_domain);
  if (bVar2) {
    pvVar4 = detail::status_code_storage<system_error2::_generic_code_domain>::value
                       ((status_code_storage<system_error2::_generic_code_domain> *)code1);
    vVar1 = *pvVar4;
    pvVar4 = detail::status_code_storage<system_error2::_generic_code_domain>::value
                       ((status_code_storage<system_error2::_generic_code_domain> *)code2);
    this_local._7_1_ = vVar1 == *pvVar4;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool _do_equivalent(const status_code<void> &code1, const status_code<void> &code2) const noexcept override  // NOLINT
  {
    assert(code1.domain() == *this);                            // NOLINT
    const auto &c1 = static_cast<const generic_code &>(code1);  // NOLINT
    if(code2.domain() == *this)
    {
      const auto &c2 = static_cast<const generic_code &>(code2);  // NOLINT
      return c1.value() == c2.value();
    }
    return false;
  }